

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_filter.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::filter_impl
          (filter_impl<std::array<unsigned_char,_16UL>_> *this)

{
  array<unsigned_char,_16UL> addr;
  range local_24;
  filter_impl<std::array<unsigned_char,_16UL>_> *local_10;
  filter_impl<std::array<unsigned_char,_16UL>_> *this_local;
  
  local_10 = this;
  ::std::
  set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
  ::set(&this->m_access_list);
  addr = zero<std::array<unsigned_char,16ul>>();
  range::range(&local_24,addr,0);
  ::std::
  set<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range,_std::less<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>,_std::allocator<libtorrent::aux::filter_impl<std::array<unsigned_char,_16UL>_>::range>_>
  ::insert(&this->m_access_list,&local_24);
  return;
}

Assistant:

filter_impl<Addr>::filter_impl()
	{
		// make the entire ip-range non-blocked
		m_access_list.insert(range(zero<Addr>(), 0));
	}